

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  CleanupNode *pCVar1;
  ArenaBlock *pAVar2;
  char *pcVar3;
  char **ppcVar4;
  char **v2;
  LogMessage *pLVar5;
  ArenaBlock *pAVar6;
  bool bVar7;
  size_t local_298;
  size_t required;
  _func_void_void_ptr *destructor_local;
  size_t align_local;
  size_t n_local;
  SerialArena *this_local;
  size_t local_258;
  size_t local_250;
  LogMessage local_238;
  Voidify local_221;
  char *local_220;
  Nullable<const_char_*> local_218;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *next;
  char *local_200;
  char *ret;
  size_t local_1f0;
  ulong local_1e8;
  SerialArena *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  SerialArena *local_1c0;
  byte local_1a1;
  LogMessage local_1a0;
  Voidify local_189;
  Nullable<const_char_*> local_188;
  SerialArena *local_180;
  char *local_178 [2];
  char *end_1;
  byte local_151;
  LogMessage local_150;
  Voidify local_139;
  char *local_138;
  char *local_130;
  Nullable<const_char_*> local_128;
  long local_120;
  char *local_118;
  size_t local_108;
  size_t local_100;
  SerialArena *local_f8;
  char *local_f0;
  char *local_e8;
  ChunkList *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  ChunkList *local_b8;
  byte local_99;
  LogMessage local_98;
  Voidify local_81;
  SerialArena *local_80;
  char *local_78;
  CleanupNode *local_70;
  char *end;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  CleanupNode *local_10;
  
  local_258 = align;
  local_250 = n;
  if (align < 9) {
    local_298 = n + 7 & 0xfffffffffffffff8;
    local_100 = n;
  }
  else {
    this_local = (SerialArena *)ArenaAlignAs(align);
    local_298 = ArenaAlign::Padded((ArenaAlign *)&this_local,local_250);
  }
  AllocateNewBlock(this,local_298);
  local_1e8 = n + 7 & 0xfffffffffffffff8;
  ret = (char *)destructor;
  local_1f0 = align;
  local_1e0 = this;
  local_108 = n;
  next = (char *)ArenaAlignAs(align);
  pcVar3 = ptr(this);
  local_200 = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&next,pcVar3);
  if (this->limit_ < local_200 + local_1e8) {
    local_1d8 = (char *)AllocateAlignedWithCleanupFallback
                                  (this,local_1e8,local_1f0,(_func_void_void_ptr *)ret);
  }
  else {
    UnpoisonMemoryRegion(local_200,local_1e8);
    absl_log_internal_check_op_result = local_200 + local_1e8;
    set_ptr(this,absl_log_internal_check_op_result);
    local_1c8 = local_200;
    local_1d0 = ret;
    local_e0 = &this->cleanup_list_;
    local_e8 = local_200;
    local_f0 = ret;
    local_1c0 = this;
    local_f8 = this;
    if ((this->cleanup_list_).next_ < (this->cleanup_list_).limit_) {
      local_c0 = local_200;
      local_c8 = ret;
      local_d8 = local_200;
      local_d0 = ret;
      pCVar1 = (this->cleanup_list_).next_;
      (this->cleanup_list_).next_ = pCVar1 + 1;
      pCVar1->elem = local_200;
      pCVar1->destructor = (_func_void_void_ptr *)ret;
      local_b8 = local_e0;
    }
    else {
      cleanup::ChunkList::AddFallback(local_e0,local_200,(_func_void_void_ptr *)ret,this);
    }
    local_99 = 0;
    bVar7 = true;
    if ((this->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
      bVar7 = (this->cleanup_list_).head_ <= (Chunk *)(this->cleanup_list_).prefetch_ptr_;
    }
    local_80 = this;
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0x136,
                 "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
                );
      local_99 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar5);
    }
    if ((local_99 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    local_28 = (this->cleanup_list_).next_;
    local_30 = (this->cleanup_list_).limit_;
    local_38 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
    local_20 = 0x180;
    if (((long)local_38 - (long)local_28 < 0x181) && (local_38 < local_30)) {
      ppcVar4 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
      local_38 = (CleanupNode *)*ppcVar4;
      local_51 = 0;
      if (local_38 == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                   ,0x122,"prefetch_ptr != nullptr");
        local_51 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar5);
      }
      if ((local_51 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      local_78 = (char *)((long)&local_38->elem + local_20);
      ppcVar4 = std::min<char_const*>((char **)&local_30,&local_78);
      local_70 = (CleanupNode *)*ppcVar4;
      for (; local_38 < local_70; local_38 = local_38 + 4) {
        local_10 = local_38;
      }
    }
    (this->cleanup_list_).prefetch_ptr_ = (char *)local_38;
    local_18 = local_38;
    ppcVar4 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&this->limit_);
    local_220 = ptr(this);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_220);
    local_218 = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                          (ppcVar4,v2,"limit_ >= ptr()");
    if (local_218 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_218);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0xf2,pcVar3);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_238);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_221,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_238);
    }
    local_188 = absl_log_internal_check_op_result;
    local_1a1 = 0;
    bVar7 = true;
    local_180 = this;
    if (this->prefetch_ptr_ != (char *)0x0) {
      pAVar2 = (ArenaBlock *)this->prefetch_ptr_;
      pAVar6 = head(this);
      bVar7 = pAVar6 <= pAVar2;
    }
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0x12d,
                 "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
                );
      local_1a1 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1a0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_189,pLVar5);
    }
    if ((local_1a1 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1a0);
    }
    local_130 = this->limit_;
    local_138 = this->prefetch_ptr_;
    local_120 = 0x400;
    local_128 = local_188;
    local_118 = local_138;
    if ((long)local_138 - (long)local_188 < 0x401) {
      if (local_138 < local_130) {
        ppcVar4 = std::max<char_const*>(&local_128,&local_138);
        local_138 = *ppcVar4;
        local_151 = 0;
        if (local_138 == (char *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_150,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                     ,0x122,"prefetch_ptr != nullptr");
          local_151 = 1;
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_150);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_139,pLVar5);
        }
        if ((local_151 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_150);
        }
        local_178[0] = local_138 + local_120;
        ppcVar4 = std::min<char_const*>(&local_130,local_178);
        for (; local_138 < *ppcVar4; local_138 = local_138 + 0x40) {
        }
      }
      local_118 = local_138;
    }
    this->prefetch_ptr_ = local_118;
    local_1d8 = local_200;
  }
  return local_1d8;
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}